

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O2

size_t qHash(QCborMap *map,size_t seed)

{
  QCborContainerPrivate *pQVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  pQVar1 = (map->d).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (pQVar1->elements).d.size | 1;
  }
  uVar2 = std::accumulate<QCborMap::ConstIterator,unsigned_long,QtPrivate::QHashCombine>
                    (pQVar1,1,pQVar1,uVar3,seed);
  return uVar2;
}

Assistant:

size_t qHash(const QCborMap &map, size_t seed)
{
    return qHashRange(map.begin(), map.end(), seed);
}